

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O0

void __thiscall cppmetrics::ScheduledReporter::loop_while_running(ScheduledReporter *this)

{
  bool bVar1;
  bool local_61;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  next_report_time;
  time_point start;
  ScheduledReporter *this_local;
  
  do {
    next_report_time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    lock._8_8_ = std::chrono::operator+(&next_report_time,&this->m_interval);
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->m_mutex);
    while( true ) {
      local_61 = false;
      if ((this->m_is_running & 1U) != 0) {
        local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_61 = std::chrono::operator>
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&lock._M_owns,&local_38);
      }
      if (local_61 == false) break;
      std::condition_variable::
      wait_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,cppmetrics::ScheduledReporter::loop_while_running()::__0>
                (&this->m_cv,(unique_lock<std::mutex> *)local_30,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&lock._M_owns,(anon_class_8_1_8991fb9c)this);
    }
    bVar1 = (this->m_is_running & 1U) != 0;
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_30);
      (*(this->super_Reporter)._vptr_Reporter[2])();
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  } while (bVar1);
  return;
}

Assistant:

void ScheduledReporter::loop_while_running()
{
  while (true)
  {
    auto start = std::chrono::system_clock::now();
    auto next_report_time = start + m_interval;

    std::unique_lock<std::mutex> lock(m_mutex);

    while (m_is_running && next_report_time > std::chrono::system_clock::now())
    {
      m_cv.wait_until(lock, next_report_time, [&]() {
        // Predicate returns 'false' if waiting should continue.
        // We want to stop waiting if we have ceased running,
        // and to continue waiting while we are running.
        return !m_is_running;
      });
    }

    if (!m_is_running)
    {
      return;
    }

    lock.unlock();
    report();
  }
}